

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void jemalloc_constructor(void)

{
  uint uVar1;
  unsigned_long_long decay;
  unsigned_long_long bgt_count;
  unsigned_long_long narenas;
  unsigned_long_long cpu_count;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  uVar1 = malloc_ncpus();
  local_10 = (ulong)uVar1;
  if (local_10 == 0) {
    uVar1 = duckdb_malloc_ncpus();
    local_10 = (ulong)uVar1;
  }
  local_18 = local_10 >> 1;
  if (local_18 == 0) {
    local_18 = 1;
  }
  local_20 = local_10 >> 4;
  if (local_20 == 0) {
    local_20 = 1;
  }
  snprintf(duckdb_je_JE_MALLOC_CONF_BUFFER,200,
           "oversize_threshold:268435456,dirty_decay_ms:%llu,muzzy_decay_ms:%llu,narenas:%llu,max_background_threads:%llu"
           ,1000,1000,local_18,local_20);
  duckdb_je_malloc_conf = duckdb_je_JE_MALLOC_CONF_BUFFER;
  if (duckdb_je_malloc_init_state != malloc_init_initialized) {
    malloc_init_hard();
  }
  return;
}

Assistant:

JEMALLOC_ATTR(constructor)
static void
jemalloc_constructor(void) {
	unsigned long long cpu_count = malloc_ncpus();
	if (cpu_count == 0) {
		cpu_count = duckdb_malloc_ncpus();
	}
	unsigned long long narenas = cpu_count / 2;
	if (narenas == 0) {
	    narenas = 1;
	}
	unsigned long long bgt_count = cpu_count / 16;
	if (bgt_count == 0) {
		bgt_count = 1;
	}
	// decay is in ms
	unsigned long long decay = DUCKDB_JEMALLOC_DECAY * 1000;
#ifdef DEBUG
	snprintf(JE_MALLOC_CONF_BUFFER, JE_MALLOC_CONF_BUFFER_SIZE, "junk:true,oversize_threshold:268435456,dirty_decay_ms:%llu,muzzy_decay_ms:%llu,narenas:%llu,max_background_threads:%llu", decay, decay, narenas, bgt_count);
#else
	snprintf(JE_MALLOC_CONF_BUFFER, JE_MALLOC_CONF_BUFFER_SIZE, "oversize_threshold:268435456,dirty_decay_ms:%llu,muzzy_decay_ms:%llu,narenas:%llu,max_background_threads:%llu", decay, decay, narenas, bgt_count);
#endif
	je_malloc_conf = JE_MALLOC_CONF_BUFFER;
	malloc_init();
}